

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl2.cpp
# Opt level: O3

void E64::sdl2_wait_until_r_released(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  SDL_Event event;
  timespec local_68;
  int local_58 [5];
  int local_44;
  
  do {
    SDL_PollEvent(local_58);
    bVar1 = local_44 == 0x72;
    bVar2 = local_58[0] == 0x301;
    local_68.tv_sec = 0;
    local_68.tv_nsec = 40000000;
    do {
      iVar3 = nanosleep(&local_68,&local_68);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (bVar1 && bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void E64::sdl2_wait_until_r_released()
{
    SDL_Event event;
    bool wait = true;
    while(wait) {
        SDL_PollEvent(&event);
        if( (event.type == SDL_KEYUP) && (event.key.keysym.sym == SDLK_r) ) wait = false;
        std::this_thread::sleep_for(std::chrono::microseconds(40000));
    }
}